

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

GLuint __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
          (ShaderImageLoadStoreBase *this,char *src_vs,char *src_tcs,char *src_tes,char *src_gs,
          char *src_fs,bool *result)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  GLuint GVar2;
  GLsizei length;
  GLint status;
  GLchar log [1024];
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  int local_430;
  int local_42c;
  GLchar local_428 [1024];
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  local_458 = src_fs;
  local_450 = src_gs;
  local_448 = src_tes;
  local_440 = src_tcs;
  local_438 = src_vs;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  if (local_438 != (char *)0x0) {
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_438,(GLint *)0x0);
    bVar1 = CompileShader(this,GVar2);
    if (!bVar1) {
      anon_unknown_0::Output("%s\n",local_438);
      if (result != (bool *)0x0) {
        *result = false;
      }
      if (!bVar1) {
        return program;
      }
    }
  }
  if (local_440 != (char *)0x0) {
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8e88);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_440,(GLint *)0x0);
    bVar1 = CompileShader(this,GVar2);
    if (!bVar1) {
      anon_unknown_0::Output("%s\n",local_440);
      if (result != (bool *)0x0) {
        *result = false;
      }
      if (!bVar1) {
        return program;
      }
    }
  }
  if (local_448 != (char *)0x0) {
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8e87);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_448,(GLint *)0x0);
    bVar1 = CompileShader(this,GVar2);
    if (!bVar1) {
      anon_unknown_0::Output("%s\n",local_448);
      if (result != (bool *)0x0) {
        *result = false;
      }
      if (!bVar1) {
        return program;
      }
    }
  }
  if (local_450 != (char *)0x0) {
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8dd9);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_450,(GLint *)0x0);
    bVar1 = CompileShader(this,GVar2);
    if (!bVar1) {
      anon_unknown_0::Output("%s\n",local_450);
      if (result != (bool *)0x0) {
        *result = false;
      }
      if (!bVar1) {
        return program;
      }
    }
  }
  if (local_458 != (char *)0x0) {
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_458,(GLint *)0x0);
    bVar1 = CompileShader(this,GVar2);
    if (!bVar1) {
      anon_unknown_0::Output("%s\n",local_458);
      if (result != (bool *)0x0) {
        *result = false;
      }
      if (!bVar1) {
        return program;
      }
    }
  }
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_42c);
  if (local_42c == 0) {
    glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,0x400,&local_430,local_428);
    if (1 < local_430) {
      anon_unknown_0::Output("Program Info Log:\n%s\n",local_428);
    }
    if (local_438 != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    if (local_440 != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    if (local_448 != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    if (local_450 != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    if (local_458 != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    if (result != (bool *)0x0) {
      *result = false;
    }
  }
  return program;
}

Assistant:

GLuint BuildProgram(const char* src_vs, const char* src_tcs, const char* src_tes, const char* src_gs,
						const char* src_fs, bool* result = NULL)
	{
		const GLuint p = glCreateProgram();

		if (src_vs)
		{
			GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_vs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_vs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_tcs)
		{
			GLuint sh = glCreateShader(GL_TESS_CONTROL_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_tcs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_tcs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_tes)
		{
			GLuint sh = glCreateShader(GL_TESS_EVALUATION_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_tes, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_tes);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_gs)
		{
			GLuint sh = glCreateShader(GL_GEOMETRY_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_gs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_gs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_fs)
		{
			GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_fs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_fs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (!LinkProgram(p))
		{
			if (src_vs)
				Output("%s\n", src_vs);
			if (src_tcs)
				Output("%s\n", src_tcs);
			if (src_tes)
				Output("%s\n", src_tes);
			if (src_gs)
				Output("%s\n", src_gs);
			if (src_fs)
				Output("%s\n", src_fs);
			if (result)
				*result = false;
			return p;
		}

		return p;
	}